

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threads.c
# Opt level: O1

sx_thread *
sx_thread_create(sx_alloc *alloc,sx_thread_cb *callback,void *user_data1,int stack_sz,char *name,
                void *user_data2)

{
  code *pcVar1;
  int iVar2;
  sx_thread *sem;
  size_t sVar3;
  sx_thread *psVar4;
  int var__a;
  pthread_attr_t attr;
  pthread_attr_t local_68;
  
  sem = (sx_thread *)
        (*alloc->alloc_cb)((void *)0x0,0xb0,0,(char *)0x0,(char *)0x0,0,alloc->user_data);
  psVar4 = (sx_thread *)0x0;
  if (sem != (sx_thread *)0x0) {
    sx_semaphore_init((sx_sem *)sem);
    sem->callback = callback;
    sem->user_data1 = user_data1;
    sem->user_data2 = user_data2;
    sVar3 = sx_os_minstacksz();
    if (stack_sz < (int)sVar3) {
      stack_sz = (int)sVar3;
    }
    sem->stack_sz = stack_sz;
    sem->running = true;
    iVar2 = pthread_attr_init(&local_68);
    if (iVar2 != 0) {
      sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/threads.c"
                        ,0xd6,"pthread_attr_init failed");
      pcVar1 = (code *)swi(3);
      psVar4 = (sx_thread *)(*pcVar1)();
      return psVar4;
    }
    iVar2 = pthread_attr_setstacksize(&local_68,(long)sem->stack_sz);
    if (iVar2 != 0) {
      sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/threads.c"
                        ,0xd8,"pthread_attr_setstacksize failed");
      pcVar1 = (code *)swi(3);
      psVar4 = (sx_thread *)(*pcVar1)();
      return psVar4;
    }
    iVar2 = pthread_create(&sem->handle,&local_68,thread_fn,sem);
    if (iVar2 != 0) {
      sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/threads.c"
                        ,0xe1,"pthread_create failed");
      pcVar1 = (code *)swi(3);
      psVar4 = (sx_thread *)(*pcVar1)();
      return psVar4;
    }
    sx_semaphore_wait((sx_sem *)sem,-1);
    psVar4 = sem;
    if (name != (char *)0x0) {
      prctl(0xf,name,0,0,0);
    }
  }
  return psVar4;
}

Assistant:

sx_thread* sx_thread_create(const sx_alloc* alloc, sx_thread_cb* callback, void* user_data1,
                            int stack_sz, const char* name, void* user_data2)
{
    sx_thread* thrd = (sx_thread*)sx_malloc(alloc, sizeof(sx_thread));
    if (!thrd)
        return NULL;

    sx_semaphore_init(&thrd->sem);
    thrd->callback = callback;
    thrd->user_data1 = user_data1;
    thrd->user_data2 = user_data2;
    thrd->stack_sz = sx_max(stack_sz, (int)sx_os_minstacksz());
    thrd->running = true;

    pthread_attr_t attr;
    int r = pthread_attr_init(&attr);
    sx_unused(r);
    sx_assertf(r == 0, "pthread_attr_init failed");
    r = pthread_attr_setstacksize(&attr, thrd->stack_sz);
    sx_assertf(r == 0, "pthread_attr_setstacksize failed");

#    if SX_PLATFORM_APPLE
    thrd->name[0] = 0;
    if (name)
        sx_strcpy(thrd->name, sizeof(thrd->name), name);
#    endif

    r = pthread_create(&thrd->handle, &attr, thread_fn, thrd);
    sx_assertf(r == 0, "pthread_create failed");

    // Ensure that thread callback is running
    sx_semaphore_wait(&thrd->sem, -1);

#    if !SX_PLATFORM_APPLE
    if (name)
        sx_thread_setname(thrd, name);
#    endif

    return thrd;
}